

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::BasicInputBase::Setup(BasicInputBase *this)

{
  float *pfVar1;
  long lVar2;
  Vector<float,_4> local_30;
  
  this->m_po = 0;
  glu::CallLogWrapper::glGenBuffers
            (&(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,&this->m_xfbo);
  for (lVar2 = 0; lVar2 != 0x400; lVar2 = lVar2 + 0x10) {
    tcu::Vector<float,_4>::Vector(&local_30,0.0);
    pfVar1 = (float *)((long)this->expected_data[0].m_data + lVar2);
    *(undefined8 *)pfVar1 = local_30.m_data._0_8_;
    *(undefined8 *)(pfVar1 + 2) = local_30.m_data._8_8_;
  }
  this->instance_count = 1;
  this->base_instance = -1;
  return 0;
}

Assistant:

virtual long Setup()
	{
		m_po = 0;
		glGenBuffers(1, &m_xfbo);
		for (int i			 = 0; i < 64; ++i)
			expected_data[i] = Vec4(0.0f);
		instance_count		 = 1;
		base_instance		 = -1;
		return NO_ERROR;
	}